

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O0

void __thiscall Hair_WhiteFurnace_Test::TestBody(Hair_WhiteFurnace_Test *this)

{
  bool bVar1;
  Float FVar2;
  float fVar3;
  double dVar4;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar9 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [16];
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  Vector3f VVar14;
  SampledSpectrum SVar15;
  AssertionResult gtest_ar_;
  Float avg;
  SampledSpectrum f;
  Vector3f wi;
  HairBxDF hair;
  SampledSpectrum sigma_a;
  Float h;
  SampledWavelengths lambda;
  int i;
  int count;
  Float ySum;
  Float beta_n;
  Float beta_m;
  Vector3f wo;
  RNG rng;
  Message *in_stack_fffffffffffffde8;
  RNG *in_stack_fffffffffffffdf0;
  float fVar16;
  Float in_stack_fffffffffffffe04;
  Float u;
  undefined1 *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  Float in_stack_fffffffffffffe14;
  undefined1 *in_stack_fffffffffffffe18;
  SampledSpectrum *in_stack_fffffffffffffe20;
  int baseIndex;
  Float eta;
  undefined3 uVar17;
  Float in_stack_fffffffffffffe2c;
  HairBxDF *this_00;
  string local_1b8 [8];
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  AssertionResult *in_stack_fffffffffffffe68;
  AssertHelper *in_stack_fffffffffffffe70;
  RNG local_178;
  float local_164;
  undefined8 local_160;
  float local_158;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  undefined8 in_stack_fffffffffffffee8;
  TransportMode mode;
  HairBxDF *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff0c;
  Tuple3<pbrt::Vector3,_float> in_stack_ffffffffffffff28;
  undefined1 local_88 [16];
  float local_78;
  int local_54;
  int local_50;
  float local_4c;
  float local_48;
  float local_44;
  undefined8 local_40;
  float local_38;
  undefined8 local_24;
  float local_1c;
  undefined1 auVar5 [64];
  
  this_00 = (HairBxDF *)&stack0xffffffffffffffe8;
  pbrt::RNG::RNG((RNG *)this_00);
  pbrt::RNG::Uniform<float>(in_stack_fffffffffffffdf0);
  pbrt::RNG::Uniform<float>(in_stack_fffffffffffffdf0);
  auVar9 = (undefined1  [56])0x0;
  pbrt::Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffdf0,
             (float)((ulong)in_stack_fffffffffffffde8 >> 0x20),SUB84(in_stack_fffffffffffffde8,0));
  VVar14 = pbrt::SampleUniformSphere
                     ((Point2f *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  local_38 = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar9;
  local_40 = vmovlpd_avx(auVar5._0_16_);
  local_24 = local_40;
  local_1c = local_38;
  for (local_44 = 0.1; local_44 < 1.0; local_44 = local_44 + 0.2) {
    for (local_48 = 0.1; local_48 < 1.0; local_48 = local_48 + 0.2) {
      local_4c = 0.0;
      uVar17 = SUB43(in_stack_fffffffffffffe2c,0);
      in_stack_fffffffffffffe2c = (Float)CONCAT13(1,uVar17);
      if (0.5 <= local_44) {
        in_stack_fffffffffffffe2c = (Float)CONCAT13(local_48 < 0.5,uVar17);
      }
      local_50 = 20000;
      if ((char)((uint)in_stack_fffffffffffffe2c >> 0x18) != '\0') {
        local_50 = 100000;
      }
      u = in_stack_fffffffffffffe04;
      for (local_54 = 0; mode = (TransportMode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
          local_54 < local_50; local_54 = local_54 + 1) {
        eta = 0.0;
        pbrt::RadicalInverse
                  ((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                   (uint64_t)in_stack_fffffffffffffe18);
        baseIndex = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
        pbrt::SampledWavelengths::SampleXYZ(u);
        FVar2 = pbrt::RadicalInverse(baseIndex,(uint64_t)in_stack_fffffffffffffe18);
        auVar10._0_8_ = (double)FVar2;
        auVar10._8_8_ = extraout_XMM0_Qb;
        auVar10 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar10,ZEXT816(0xbff0000000000000));
        dVar4 = pbrt::Clamp<double,double,double>(auVar10._0_8_,-0.999999,0.999999);
        local_78 = (float)dVar4;
        in_stack_fffffffffffffe08 = local_88;
        in_stack_fffffffffffffe10 = 0;
        pbrt::SampledSpectrum::SampledSpectrum
                  ((SampledSpectrum *)in_stack_fffffffffffffdf0,
                   (Float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        in_stack_fffffffffffffe20 = (SampledSpectrum *)&stack0xffffffffffffff28;
        pbrt::HairBxDF::HairBxDF
                  (this_00,in_stack_fffffffffffffe2c,eta,in_stack_fffffffffffffe20,
                   (Float)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                   SUB84(in_stack_fffffffffffffe18,0),in_stack_fffffffffffffe14);
        in_stack_fffffffffffffe14 =
             pbrt::RadicalInverse
                       ((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                        (uint64_t)in_stack_fffffffffffffe18);
        pbrt::RadicalInverse
                  ((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                   (uint64_t)in_stack_fffffffffffffe18);
        auVar9 = (undefined1  [56])0x0;
        in_stack_fffffffffffffe18 = &stack0xffffffffffffff10;
        pbrt::Point2<float>::Point2
                  ((Point2<float> *)in_stack_fffffffffffffdf0,
                   (float)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                   SUB84(in_stack_fffffffffffffde8,0));
        VVar14 = pbrt::SampleUniformSphere
                           ((Point2f *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
                           );
        local_158 = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar6._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar6._8_56_ = auVar9;
        local_160 = vmovlpd_avx(auVar6._0_16_);
        local_128 = local_1c;
        local_130 = local_24;
        local_148 = local_1c;
        local_150 = local_24;
        auVar9 = ZEXT856(0);
        auVar13 = (undefined1  [56])0x0;
        VVar14.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_ffffffffffffff0c;
        VVar14.super_Tuple3<pbrt::Vector3,_float>.z =
             (float)(int)((ulong)in_stack_ffffffffffffff0c >> 0x20);
        VVar14.super_Tuple3<pbrt::Vector3,_float>.x = local_158;
        local_140 = local_160;
        local_138 = local_158;
        SVar15 = pbrt::HairBxDF::f(in_stack_fffffffffffffef0,(Vector3f)in_stack_ffffffffffffff28,
                                   VVar14,mode);
        auVar11._0_8_ = SVar15.values.values._8_8_;
        auVar11._8_56_ = auVar13;
        auVar7._0_8_ = SVar15.values.values._0_8_;
        auVar7._8_56_ = auVar9;
        local_120 = vmovlpd_avx(auVar7._0_16_);
        in_stack_fffffffffffffee8 = vmovlpd_avx(auVar11._0_16_);
        pbrt::AbsCosTheta((Vector3f *)0x4f7f23);
        auVar9 = extraout_var;
        SVar15 = pbrt::SampledSpectrum::operator*
                           ((SampledSpectrum *)in_stack_fffffffffffffdf0,
                            (Float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        auVar12._0_8_ = SVar15.values.values._8_8_;
        auVar12._8_56_ = auVar13;
        auVar8._0_8_ = SVar15.values.values._0_8_;
        auVar8._8_56_ = auVar9;
        in_stack_fffffffffffffef0 = (HairBxDF *)vmovlpd_avx(auVar8._0_16_);
        vmovlpd_avx(auVar12._0_16_);
        FVar2 = pbrt::SampledSpectrum::y
                          ((SampledSpectrum *)this_00,
                           (SampledWavelengths *)CONCAT44(in_stack_fffffffffffffe2c,eta));
        local_4c = FVar2 + local_4c;
      }
      fVar3 = (float)local_50;
      fVar16 = local_4c;
      FVar2 = pbrt::UniformSpherePDF();
      local_164 = fVar16 / (fVar3 * FVar2);
      in_stack_fffffffffffffe04 = (Float)((uint)u & 0xffffff);
      if (0.95 <= local_164) {
        in_stack_fffffffffffffe04 = (Float)CONCAT13(local_164 <= 1.05,SUB43(u,0));
      }
      in_stack_fffffffffffffdf0 = &local_178;
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)in_stack_fffffffffffffdf0,
                 SUB81((ulong)in_stack_fffffffffffffde8 >> 0x38,0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)in_stack_fffffffffffffdf0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe20);
        in_stack_fffffffffffffde8 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffdf0,(float *)in_stack_fffffffffffffde8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   in_stack_fffffffffffffe50);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe20,
                   (Type)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffe04,fVar16));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe70,(Message *)in_stack_fffffffffffffe68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdf0);
        std::__cxx11::string::~string(local_1b8);
        testing::Message::~Message((Message *)0x4f810f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x4f8184);
    }
  }
  return;
}

Assistant:

TEST(Hair, WhiteFurnace) {
    RNG rng;
    Vector3f wo = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
    for (Float beta_m = .1; beta_m < 1; beta_m += .2) {
        for (Float beta_n = .1; beta_n < 1; beta_n += .2) {
            // Estimate reflected uniform incident radiance from hair
            Float ySum = 0;

            // More samples for the smooth case, since we're sampling blindly.
            int count = (beta_m < .5 || beta_n < .5) ? 100000 : 20000;

            for (int i = 0; i < count; ++i) {
                SampledWavelengths lambda =
                    SampledWavelengths::SampleXYZ(RadicalInverse(0, i));

                Float h = Clamp(-1 + 2. * RadicalInverse(1, i), -.999999, .999999);
                SampledSpectrum sigma_a(0.f);
                HairBxDF hair(h, 1.55, sigma_a, beta_m, beta_n, 0.f);
                Vector3f wi =
                    SampleUniformSphere({RadicalInverse(2, i), RadicalInverse(3, i)});

                SampledSpectrum f =
                    hair.f(wo, wi, TransportMode::Radiance) * AbsCosTheta(wi);
                ySum += f.y(lambda);
            }

            Float avg = ySum / (count * UniformSpherePDF());
            EXPECT_TRUE(avg >= .95 && avg <= 1.05) << avg;
        }
    }
}